

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O3

void __thiscall OpenMD::HBondJumpZ::writeCorrelate(HBondJumpZ *this)

{
  double *pdVar1;
  char cVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  Revision r;
  ofstream ofs;
  Revision local_251;
  string local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream
            (&local_230,
             (this->super_HBondJump).super_TimeCorrFunc<double>.super_DynamicProperty.
             outputFilename_._M_dataplus._M_p,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    snprintf(painCave.errMsg,2000,"HBondJumpZ::writeCorrelate Error: fail to open %s\n",
             (this->super_HBondJump).super_TimeCorrFunc<double>.super_DynamicProperty.
             outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,
                        (this->super_HBondJump).super_TimeCorrFunc<double>.corrFuncType_._M_dataplus
                        ._M_p,(this->super_HBondJump).super_TimeCorrFunc<double>.corrFuncType_.
                              _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# OpenMD ",9);
    Revision::getFullRevision_abi_cxx11_(&local_250,&local_251);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,local_250._M_dataplus._M_p,local_250._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
    Revision::getBuildDate_abi_cxx11_(&local_250,&local_251);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,local_250._M_dataplus._M_p,local_250._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"# selection script1: \"",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,
               (this->super_HBondJump).super_TimeCorrFunc<double>.selectionScript1_._M_dataplus._M_p
               ,(this->super_HBondJump).super_TimeCorrFunc<double>.selectionScript1_.
                _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"\"\tselection script2: \"",0x16);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,
                        (this->super_HBondJump).super_TimeCorrFunc<double>.selectionScript2_.
                        _M_dataplus._M_p,
                        (this->super_HBondJump).super_TimeCorrFunc<double>.selectionScript2_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"# privilegedAxis computed as ",0x1d);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->axisLabel_)._M_dataplus._M_p,
                        (this->axisLabel_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," axis \n",7);
    if ((this->super_HBondJump).super_TimeCorrFunc<double>.paramString_._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# parameters: ",0xe)
      ;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,
                          (this->super_HBondJump).super_TimeCorrFunc<double>.paramString_.
                          _M_dataplus._M_p,
                          (this->super_HBondJump).super_TimeCorrFunc<double>.paramString_.
                          _M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#time\tcorrVal\n",0xe)
    ;
    if ((this->super_HBondJump).super_TimeCorrFunc<double>.nTimeBins_ != 0) {
      uVar4 = 0;
      do {
        pdVar1 = (this->super_HBondJump).super_TimeCorrFunc<double>.times_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        std::ostream::_M_insert<double>(pdVar1[uVar4] - *pdVar1);
        if (this->nZBins_ != 0) {
          uVar5 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
            std::ostream::_M_insert<double>
                      (*(double *)
                        (*(long *)&(this->histogram_).
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data + uVar5 * 8));
            uVar5 = uVar5 + 1;
          } while (uVar5 < this->nZBins_);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
        uVar4 = uVar4 + 1;
      } while (uVar4 < (this->super_HBondJump).super_TimeCorrFunc<double>.nTimeBins_);
    }
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void HBondJumpZ::writeCorrelate() {
    ofstream ofs(outputFilename_.c_str());

    if (ofs.is_open()) {
      Revision r;

      ofs << "# " << getCorrFuncType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      ofs << "# selection script1: \"" << selectionScript1_;
      ofs << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      ofs << "# privilegedAxis computed as " << axisLabel_ << " axis \n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";
      ofs << "#time\tcorrVal\n";

      for (unsigned int i = 0; i < nTimeBins_; ++i) {
        ofs << times_[i] - times_[0];

        for (unsigned int j = 0; j < nZBins_; ++j) {
          ofs << "\t" << histogram_[i][j];
        }
        ofs << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "HBondJumpZ::writeCorrelate Error: fail to open %s\n",
               outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    ofs.close();
  }